

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void skip_utf8_bom_should_not_skip_bom_if_not_at_beginning(void)

{
  long lVar1;
  parse_buffer *ppVar2;
  long in_FS_OFFSET;
  undefined1 local_50 [8];
  parse_buffer buffer;
  uchar string [7];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  buffer.hooks.reallocate._1_4_ = 0xbfbbef20;
  buffer.hooks.reallocate._5_2_ = 0x7d7b;
  buffer.hooks.reallocate._7_1_ = 0;
  memset(local_50,0,0x38);
  local_50 = (undefined1  [8])((long)&buffer.hooks.reallocate + 1);
  buffer.content = (uchar *)0x7;
  buffer.depth = (size_t)global_hooks.allocate;
  buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  buffer.length = 1;
  ppVar2 = skip_utf8_bom((parse_buffer *)local_50);
  if (ppVar2 != (parse_buffer *)0x0) {
    UnityFail(" Expected NULL",0x222);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void skip_utf8_bom_should_not_skip_bom_if_not_at_beginning(void)
{
    const unsigned char string[] = " \xEF\xBB\xBF{}";
    parse_buffer buffer = {0, 0, 0, 0, {0, 0, 0}};
    buffer.content = string;
    buffer.length = sizeof(string);
    buffer.hooks = global_hooks;
    buffer.offset = 1;

    TEST_ASSERT_NULL(skip_utf8_bom(&buffer));
}